

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

int32_t __thiscall icu_63::Package::findNextItem(Package *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  int32_t middleLength;
  int32_t nameLength;
  int32_t idx;
  char *treeSep;
  char *middle;
  char *name;
  Package *this_local;
  
  if (-1 < this->findNextIndex) {
    while (this->findNextIndex < this->itemCount) {
      iVar1 = this->findNextIndex;
      this->findNextIndex = iVar1 + 1;
      __s = this->items[iVar1].name;
      sVar7 = strlen(__s);
      iVar4 = (int)sVar7;
      if (this->findPrefixLength + this->findSuffixLength <= iVar4) {
        if ((0 < this->findPrefixLength) &&
           (iVar5 = memcmp(this->findPrefix,__s,(long)this->findPrefixLength), iVar5 != 0)) break;
        iVar5 = this->findPrefixLength;
        iVar2 = this->findPrefixLength;
        iVar3 = this->findSuffixLength;
        if ((this->findSuffixLength < 1) ||
           (iVar6 = memcmp(this->findSuffix,__s + (iVar4 - this->findSuffixLength),
                           (long)this->findSuffixLength), iVar6 == 0)) {
          if ((this->matchMode & 1) == 0) {
            return iVar1;
          }
          pcVar8 = strchr(__s + iVar5,0x2f);
          if (pcVar8 == (char *)0x0) {
            return iVar1;
          }
          if ((long)((iVar4 - iVar2) - iVar3) <= (long)pcVar8 - (long)(__s + iVar5)) {
            return iVar1;
          }
        }
      }
    }
    this->findNextIndex = -1;
  }
  return -1;
}

Assistant:

int32_t
Package::findNextItem() {
    const char *name, *middle, *treeSep;
    int32_t idx, nameLength, middleLength;

    if(findNextIndex<0) {
        return -1;
    }

    while(findNextIndex<itemCount) {
        idx=findNextIndex++;
        name=items[idx].name;
        nameLength=(int32_t)strlen(name);
        if(nameLength<(findPrefixLength+findSuffixLength)) {
            // item name too short for prefix & suffix
            continue;
        }
        if(findPrefixLength>0 && 0!=memcmp(findPrefix, name, findPrefixLength)) {
            // left the range of names with this prefix
            break;
        }
        middle=name+findPrefixLength;
        middleLength=nameLength-findPrefixLength-findSuffixLength;
        if(findSuffixLength>0 && 0!=memcmp(findSuffix, name+(nameLength-findSuffixLength), findSuffixLength)) {
            // suffix does not match
            continue;
        }
        // prefix & suffix match

        if(matchMode&MATCH_NOSLASH) {
            treeSep=strchr(middle, U_TREE_ENTRY_SEP_CHAR);
            if(treeSep!=NULL && (treeSep-middle)<middleLength) {
                // the middle (matching the * wildcard) contains a tree separator /
                continue;
            }
        }

        // found a matching item
        return idx;
    }

    // no more items
    findNextIndex=-1;
    return -1;
}